

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retIncrem.c
# Opt level: O1

void Abc_NtkRetimeNode(Abc_Obj_t *pObj,int fForward,int fInitial)

{
  int iVar1;
  Vec_Ptr_t *vNodes;
  void **ppvVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pFaninNew;
  Abc_Obj_t *pObj_00;
  char *pName;
  long lVar4;
  Abc_Ntk_t *local_38;
  
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  vNodes->nCap = 10;
  vNodes->nSize = 0;
  ppvVar2 = (void **)malloc(0x50);
  vNodes->pArray = ppvVar2;
  if (fForward == 0) {
    if (fInitial == 0) {
      local_38 = (Abc_Ntk_t *)0x0;
    }
    else {
      local_38 = (Abc_Ntk_t *)
                 **(undefined8 **)((long)pObj->pNtk->vObjs->pArray[*(pObj->vFanouts).pArray] + 0x40)
      ;
      Abc_NtkDupObj(local_38,pObj,0);
      if (0 < (pObj->vFanouts).nSize) {
        lVar4 = 0;
        do {
          pAVar3 = *(Abc_Obj_t **)
                    ((long)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar4]] + 0x40);
          if ((pAVar3->vFanins).nSize != 0) {
            __assert_fail("Abc_ObjFaninNum(pNext->pCopy) == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/ret/retIncrem.c"
                          ,0x163,"void Abc_NtkRetimeNode(Abc_Obj_t *, int, int)");
          }
          Abc_ObjAddFanin(pAVar3,(pObj->field_6).pCopy);
          lVar4 = lVar4 + 1;
        } while (lVar4 < (pObj->vFanouts).nSize);
      }
    }
    Abc_NodeCollectFanouts(pObj,vNodes);
    if (0 < vNodes->nSize) {
      lVar4 = 0;
      do {
        pAVar3 = (Abc_Obj_t *)vNodes->pArray[lVar4];
        if ((*(uint *)&pAVar3->field_0x14 & 0xf) != 8) {
          __assert_fail("Abc_ObjIsLatch(pNext)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/ret/retIncrem.c"
                        ,0x16c,"void Abc_NtkRetimeNode(Abc_Obj_t *, int, int)");
        }
        Abc_ObjTransferFanout(pAVar3,pObj);
        Abc_NtkDeleteObj(pAVar3);
        lVar4 = lVar4 + 1;
      } while (lVar4 < vNodes->nSize);
    }
    if (0 < (pObj->vFanins).nSize) {
      lVar4 = 0;
      do {
        pAVar3 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar4]];
        pFaninNew = Abc_NtkCreateObj(pObj->pNtk,ABC_OBJ_LATCH);
        Abc_ObjPatchFanin(pObj,pAVar3,pFaninNew);
        Abc_ObjAddFanin(pFaninNew,pAVar3);
        if (fInitial != 0) {
          pObj_00 = Abc_NtkCreateNodeBuf(local_38,(Abc_Obj_t *)0x0);
          (pFaninNew->field_6).pCopy = pObj_00;
          pName = Abc_ObjName(pAVar3);
          Abc_ObjAssignName(pObj_00,pName,"_buf");
          Abc_ObjAddFanin((pObj->field_6).pCopy,(pFaninNew->field_6).pCopy);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < (pObj->vFanins).nSize);
    }
  }
  else {
    if (fInitial != 0) {
      iVar1 = Abc_ObjSopSimulate(pObj);
      pObj->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)(long)iVar1;
    }
    Abc_NodeCollectFanins(pObj,vNodes);
    if (0 < vNodes->nSize) {
      lVar4 = 0;
      do {
        pAVar3 = (Abc_Obj_t *)vNodes->pArray[lVar4];
        if ((*(uint *)&pAVar3->field_0x14 & 0xf) != 8) {
          __assert_fail("Abc_ObjIsLatch(pNext)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/ret/retIncrem.c"
                        ,0x14c,"void Abc_NtkRetimeNode(Abc_Obj_t *, int, int)");
        }
        Abc_ObjPatchFanin(pObj,pAVar3,
                          (Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray]);
        if ((pAVar3->vFanouts).nSize == 0) {
          Abc_NtkDeleteObj(pAVar3);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < vNodes->nSize);
    }
    pAVar3 = Abc_NtkCreateObj(pObj->pNtk,ABC_OBJ_LATCH);
    if (0 < (pObj->vFanouts).nSize) {
      Abc_ObjTransferFanout(pObj,pAVar3);
    }
    Abc_ObjAddFanin(pAVar3,pObj);
    if (fInitial != 0) {
      pAVar3->field_6 = pObj->field_6;
    }
  }
  if (vNodes->pArray != (void **)0x0) {
    free(vNodes->pArray);
    vNodes->pArray = (void **)0x0;
  }
  free(vNodes);
  return;
}

Assistant:

void Abc_NtkRetimeNode( Abc_Obj_t * pObj, int fForward, int fInitial )
{
    Abc_Ntk_t * pNtkNew = NULL;
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNext, * pLatch;
    int i;
    vNodes = Vec_PtrAlloc( 10 );
    if ( fForward ) 
    {
        // compute the initial value
        if ( fInitial )
            pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)Abc_ObjSopSimulate( pObj );
        // collect fanins
        Abc_NodeCollectFanins( pObj, vNodes );
        // make the node point to the fanins fanins
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNext, i )
        {
            assert( Abc_ObjIsLatch(pNext) );
            Abc_ObjPatchFanin( pObj, pNext, Abc_ObjFanin0(pNext) );
            if ( Abc_ObjFanoutNum(pNext) == 0 )
                Abc_NtkDeleteObj(pNext);            
        }
        // add a new latch on top
        pNext = Abc_NtkCreateLatch(pObj->pNtk);
        if ( Abc_ObjFanoutNum(pObj) > 0 )
            Abc_ObjTransferFanout( pObj, pNext );
        Abc_ObjAddFanin( pNext, pObj );
        // set the initial value
        if ( fInitial )
            pNext->pCopy = pObj->pCopy;
    }
    else
    {
        // compute the initial value
        if ( fInitial )
        {
            pNtkNew = Abc_ObjFanout0(pObj)->pCopy->pNtk;
            Abc_NtkDupObj( pNtkNew, pObj, 0 );
            Abc_ObjForEachFanout( pObj, pNext, i )
            {
                assert( Abc_ObjFaninNum(pNext->pCopy) == 0 );
                Abc_ObjAddFanin( pNext->pCopy, pObj->pCopy );
            }
        }
        // collect fanouts
        Abc_NodeCollectFanouts( pObj, vNodes );
        // make the fanouts fanouts point to the node
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNext, i )
        {
            assert( Abc_ObjIsLatch(pNext) );
            Abc_ObjTransferFanout( pNext, pObj );
            Abc_NtkDeleteObj( pNext );  
        }
        // add new latches to the fanins
        Abc_ObjForEachFanin( pObj, pNext, i )
        {
            pLatch = Abc_NtkCreateLatch(pObj->pNtk);
            Abc_ObjPatchFanin( pObj, pNext, pLatch );
            Abc_ObjAddFanin( pLatch, pNext );
            // create buffer isomorphic to this latch
            if ( fInitial )
            {
                pLatch->pCopy = Abc_NtkCreateNodeBuf( pNtkNew, NULL );
                Abc_ObjAssignName( pLatch->pCopy, Abc_ObjName(pNext), "_buf" );
                Abc_ObjAddFanin( pObj->pCopy, pLatch->pCopy );
            }
        }
    }
    Vec_PtrFree( vNodes );
}